

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void show_obj(wchar_t obj_num,wchar_t row,wchar_t col,_Bool cursor,olist_detail_t mode)

{
  byte bVar1;
  object *obj_00;
  loc_conflict grid;
  _Bool _Var2;
  int16_t iVar3;
  wchar_t wVar4;
  int iVar5;
  size_t sVar6;
  class_book_conflict *pcVar7;
  store *store_00;
  bool bVar8;
  wchar_t local_b8;
  int local_b0;
  wchar_t weight;
  wchar_t fail_1;
  wchar_t fail;
  wchar_t price;
  store *store;
  wchar_t truncate;
  wchar_t equip_label_size;
  wchar_t label_size;
  _Bool show_label;
  object *obj;
  char buf [80];
  wchar_t ex_offset_ctr;
  wchar_t label_attr;
  wchar_t attr;
  olist_detail_t mode_local;
  _Bool cursor_local;
  wchar_t col_local;
  wchar_t row_local;
  wchar_t obj_num_local;
  
  buf[0x4c] = '\x01';
  buf[0x4d] = '\0';
  buf[0x4e] = '\0';
  buf[0x4f] = '\0';
  if (cursor) {
    buf[0x4c] = '\x0e';
    buf[0x4d] = '\0';
    buf[0x4e] = '\0';
    buf[0x4f] = '\0';
  }
  obj_00 = items[obj_num].object;
  bVar8 = (mode & (OLIST_DEATH|OLIST_WINDOW)) != OLIST_NONE;
  if (bVar8) {
    sVar6 = strlen(items[obj_num].label);
    local_b0 = (int)sVar6;
  }
  else {
    local_b0 = 0;
  }
  sVar6 = strlen(items[obj_num].equip_label);
  iVar5 = (int)sVar6;
  if (col + L'\xffffffff' < 0) {
    local_b8 = L'\0';
  }
  else {
    local_b8 = col + L'\xffffffff';
  }
  prt("",row + obj_num,local_b8);
  sVar6 = strlen(items[obj_num].label);
  if (sVar6 != 0) {
    if (bVar8) {
      c_put_str((uint8_t)buf._76_4_,items[obj_num].label,row + obj_num,col);
    }
    c_put_str((uint8_t)buf._76_4_,items[obj_num].equip_label,row + obj_num,col + local_b0);
    sVar6 = strlen(items[obj_num].o_name);
    if ((ulong)(long)ex_offset < (long)(local_b0 + iVar5) + sVar6) {
      store._0_4_ = (ex_offset - local_b0) - iVar5;
      if ((int)(uint)store < 0) {
        store._0_4_ = 0;
      }
      if (0x4f < (uint)store) {
        store._0_4_ = 0x4f;
      }
      *(undefined1 *)((long)obj_num * 0x100 + 0x3173a8 + (long)(int)(uint)store) = 0;
    }
    if (obj_00 == (object *)0x0) {
      ex_offset_ctr._0_1_ = '\x02';
    }
    else {
      ex_offset_ctr._0_1_ = (uint8_t)obj_00->kind->base->attr;
      _Var2 = tval_is_book_k(obj_00->kind);
      if ((_Var2) &&
         (pcVar7 = player_object_to_book(player,obj_00), pcVar7 == (class_book_conflict *)0x0)) {
        ex_offset_ctr._0_1_ = '\x02';
      }
    }
    c_put_str((uint8_t)ex_offset_ctr,items[obj_num].o_name,row + obj_num,col + local_b0 + iVar5);
    if (obj_00 != (object *)0x0) {
      buf[0x48] = (undefined1)ex_offset;
      buf[0x49] = ex_offset._1_1_;
      buf[0x4a] = ex_offset._2_1_;
      buf[0x4b] = ex_offset._3_1_;
      if (((mode & OLIST_PRICE) != OLIST_NONE) &&
         (grid.x = (player->grid).x, grid.y = (player->grid).y,
         store_00 = store_at((chunk *)cave,grid), store_00 != (store *)0x0)) {
        wVar4 = price_item(store_00,obj_00,true,(uint)obj_00->number);
        strnfmt((char *)&obj,0x50,"%6d au",(ulong)(uint)wVar4);
        put_str((char *)&obj,row + obj_num,col + buf._72_4_);
        buf._72_4_ = buf._72_4_ + 9;
      }
      if (((mode & OLIST_FAIL) != OLIST_NONE) && (_Var2 = obj_can_fail(obj_00), _Var2)) {
        wVar4 = get_use_device_chance(obj_00);
        _Var2 = object_effect_is_known(obj_00);
        if (_Var2) {
          strnfmt((char *)&obj,0x50,"%4d%% fail",(ulong)(uint)((wVar4 + L'\t') / 10));
        }
        else {
          my_strcpy((char *)&obj,"    ? fail",0x50);
        }
        put_str((char *)&obj,row + obj_num,col + buf._72_4_);
        buf._72_4_ = buf._72_4_ + 10;
      }
      if ((mode & OLIST_RECHARGE) != OLIST_NONE) {
        wVar4 = recharge_failure_chance(obj_00,player->upkeep->recharge_pow);
        iVar5 = (int)(1000 / (long)wVar4);
        _Var2 = object_effect_is_known(obj_00);
        if (_Var2) {
          strnfmt((char *)&obj,0x50,"%2d.%1d%% fail",(long)iVar5 / 10 & 0xffffffff,
                  (long)iVar5 % 10 & 0xffffffff);
        }
        else {
          my_strcpy((char *)&obj,"    ? fail",0x50);
        }
        put_str((char *)&obj,row + obj_num,col + buf._72_4_);
        buf._72_4_ = buf._72_4_ + 10;
      }
      if ((mode & OLIST_WEIGHT) != OLIST_NONE) {
        bVar1 = obj_00->number;
        iVar3 = object_weight_one(obj_00);
        iVar5 = (uint)bVar1 * (int)iVar3;
        strnfmt((char *)&obj,0x50,"%4d.%1d lb",(long)iVar5 / 10 & 0xffffffff,
                (long)iVar5 % 10 & 0xffffffff);
        put_str((char *)&obj,row + obj_num,col + buf._72_4_);
      }
    }
  }
  return;
}

Assistant:

static void show_obj(int obj_num, int row, int col, bool cursor,
					 olist_detail_t mode)
{
	int attr;
	int label_attr = cursor ? COLOUR_L_BLUE : COLOUR_WHITE;
	int ex_offset_ctr;
	char buf[80];
	struct object *obj = items[obj_num].object;
	bool show_label = mode & (OLIST_WINDOW | OLIST_DEATH) ? true : false;
	int label_size = show_label ? strlen(items[obj_num].label) : 0;
	int equip_label_size = strlen(items[obj_num].equip_label);

	/* Clear the line */
	prt("", row + obj_num, MAX(col - 1, 0));

	/* If we have no label then we won't display anything */
	if (!strlen(items[obj_num].label)) return;

	/* Print the label */
	if (show_label)
		c_put_str(label_attr, items[obj_num].label, row + obj_num, col);

	/* Print the equipment label */
	c_put_str(label_attr, items[obj_num].equip_label, row + obj_num,
			  col + label_size);

	/* Limit object name */
	if (label_size + equip_label_size + strlen(items[obj_num].o_name) >
		(size_t)ex_offset) {
		int truncate = ex_offset - label_size - equip_label_size;

		if (truncate < 0) truncate = 0;
		if ((size_t)truncate > sizeof(items[obj_num].o_name) - 1)
			truncate = sizeof(items[obj_num].o_name) - 1;

		items[obj_num].o_name[truncate] = '\0';
	}

	/* Item kind determines the color of the output */
	if (obj) {
		attr = obj->kind->base->attr;

		/* Unreadable books are a special case */
		if (tval_is_book_k(obj->kind) &&
			(player_object_to_book(player, obj) == NULL)) {
			attr = COLOUR_SLATE;
		}
	} else {
		attr = COLOUR_SLATE;
	}

	/* Object name */
	c_put_str(attr, items[obj_num].o_name, row + obj_num,
			  col + label_size + equip_label_size);

	/* If we don't have an object, we can skip the rest of the output */
	if (!obj) return;

	/* Extra fields */
	ex_offset_ctr = ex_offset;

	/* Price */
	if (mode & OLIST_PRICE) {
		struct store *store = store_at(cave, player->grid);
		if (store) {
			int price = price_item(store, obj, true, obj->number);

			strnfmt(buf, sizeof(buf), "%6d au", price);
			put_str(buf, row + obj_num, col + ex_offset_ctr);
			ex_offset_ctr += 9;
		}
	}

	/* Failure chance for magic devices and activations */
	if (mode & OLIST_FAIL && obj_can_fail(obj)) {
		int fail = (9 + get_use_device_chance(obj)) / 10;
		if (object_effect_is_known(obj))
			strnfmt(buf, sizeof(buf), "%4d%% fail", fail);
		else
			my_strcpy(buf, "    ? fail", sizeof(buf));
		put_str(buf, row + obj_num, col + ex_offset_ctr);
		ex_offset_ctr += 10;
	}

	/* Failure chances for recharging an item; see effect_handler_RECHARGE */
	if (mode & OLIST_RECHARGE) {
		int fail = 1000 / recharge_failure_chance(obj, player->upkeep->recharge_pow);
		if (object_effect_is_known(obj))
			strnfmt(buf, sizeof(buf), "%2d.%1d%% fail", fail / 10, fail % 10);
		else
			my_strcpy(buf, "    ? fail", sizeof(buf));
		put_str(buf, row + obj_num, col + ex_offset_ctr);
		ex_offset_ctr += 10;
	}

	/* Weight */
	if (mode & OLIST_WEIGHT) {
		int weight = obj->number * object_weight_one(obj);
		strnfmt(buf, sizeof(buf), "%4d.%1d lb", weight / 10, weight % 10);
		put_str(buf, row + obj_num, col + ex_offset_ctr);
	}
}